

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalaha.h
# Opt level: O0

void __thiscall KalahaState<(short)6>::collect_seeds(KalahaState<(short)6> *this)

{
  long in_RDI;
  short *seed_1;
  short *__end0_1;
  short *__begin0_1;
  short (*__range2_1) [6];
  short *seed;
  short *__end0;
  short *__begin0;
  short (*__range2) [6];
  short *local_38;
  KalahaState<(short)6> *local_18;
  KalahaState<(short)6> *in_stack_fffffffffffffff0;
  
  check_invariant(in_stack_fffffffffffffff0);
  for (local_18 = (KalahaState<(short)6> *)(in_RDI + 8);
      local_18 != (KalahaState<(short)6> *)(in_RDI + 0x14);
      local_18 = (KalahaState<(short)6> *)&local_18->field_0x2) {
    *(short *)(in_RDI + 0x20) = *(short *)(in_RDI + 0x20) + *(short *)local_18;
    *(short *)local_18 = 0;
  }
  for (local_38 = (short *)(in_RDI + 0x14); local_38 != (short *)(in_RDI + 0x20);
      local_38 = local_38 + 1) {
    *(short *)(in_RDI + 0x22) = *(short *)(in_RDI + 0x22) + *local_38;
    *local_38 = 0;
  }
  check_invariant((KalahaState<(short)6> *)(in_RDI + 8));
  return;
}

Assistant:

void collect_seeds()
	{
		check_invariant();
		for (auto& seed: player1_bins) {
			player1_store += seed;
			seed = 0;
		}

		for (auto& seed: player2_bins) {
			player2_store += seed;
			seed = 0;
		}
		check_invariant();
	}